

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Statement * ifStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  Statement statement;
  int iVar1;
  Expression *pEVar2;
  Statement *s;
  Token local_1a0;
  Token local_180;
  Token local_160;
  Block local_140;
  Token local_130;
  Statement local_110;
  undefined1 local_d0 [8];
  Block elseifBlock;
  Statement *local_b8;
  Token local_b0;
  Token local_90;
  Token local_70;
  Token local_50;
  Token local_30;
  Compiler *local_10;
  Compiler *compiler_local;
  
  __return_storage_ptr__->type = STATEMENT_IF;
  local_10 = compiler;
  iVar1 = presentLine();
  (__return_storage_ptr__->field_1).blockStatement.numStatements = iVar1;
  *(undefined4 *)&(__return_storage_ptr__->field_1).breakStatement.pos.file = 0;
  (__return_storage_ptr__->field_1).ifStatement.elseBranch.numStatements = 0;
  consume(&local_30,TOKEN_LEFT_PAREN,
          "Conditionals must start with an openning brace[\'(\'] after If!");
  pEVar2 = expression();
  (__return_storage_ptr__->field_1).ifStatement.condition = pEVar2;
  consume(&local_50,TOKEN_RIGHT_PAREN,"Conditional must end with a closing brace[\')\'] after If!");
  consume(&local_70,TOKEN_NEWLINE,"Expected newline after If!");
  iVar1 = getNextIndent();
  if (iVar1 == local_10->indentLevel) {
    consumeIndent(local_10->indentLevel);
    consume(&local_90,TOKEN_THEN,"Expected Then on the same indent!");
    consume(&local_b0,TOKEN_NEWLINE,"Expected newline after Then!");
  }
  join_0x00000010_0x00000000_ = blockStatement(local_10,BLOCK_IF);
  *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x10) = elseifBlock.statements;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)local_b8;
  consumeIndent(local_10->indentLevel);
  iVar1 = match(TOKEN_ELSE);
  if (iVar1 == 0) {
    consume(&local_1a0,TOKEN_ENDIF,"Expected EndIf after If!");
    consume((Token *)&s,TOKEN_NEWLINE,"Expected newline after EndIf!");
  }
  else {
    iVar1 = match(TOKEN_IF);
    if (iVar1 == 0) {
      consume(&local_130,TOKEN_NEWLINE,"Expected newline after Else!");
      local_140 = blockStatement(local_10,BLOCK_ELSE);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_140._0_8_;
      *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) = local_140.statements;
      consumeIndent(local_10->indentLevel);
      consume(&local_160,TOKEN_ENDIF,"Expected EndIf after If!");
      consume(&local_180,TOKEN_NEWLINE,"Expected newline after EndIf!");
    }
    else {
      local_d0._0_4_ = 0;
      local_d0._4_4_ = BLOCK_ELSE;
      elseifBlock.numStatements = 0;
      elseifBlock.blockName = BLOCK_IF;
      ifStatement(&local_110,local_10);
      statement.field_1._0_8_ = local_110.field_1._0_8_;
      statement.type = local_110.type;
      statement._4_4_ = local_110._4_4_;
      statement.field_1.blockStatement.statements = local_110.field_1.blockStatement.statements;
      statement.field_1.breakStatement.pos.file = local_110.field_1.breakStatement.pos.file;
      statement.field_1.ifStatement.thenBranch.statements =
           local_110.field_1.ifStatement.thenBranch.statements;
      statement.field_1._32_8_ = local_110.field_1._32_8_;
      statement.field_1.ifStatement.elseBranch.statements =
           local_110.field_1.ifStatement.elseBranch.statements;
      statement.field_1.routine.code.statements = local_110.field_1.routine.code.statements;
      addToBlock((Block *)local_d0,statement);
      *(undefined1 (*) [8])((long)&__return_storage_ptr__->field_1 + 0x20) = local_d0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = elseifBlock._0_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Statement ifStatement(Compiler *compiler){
    debug("Parsing if statement");
    Statement s;
    s.type = STATEMENT_IF;
    s.ifStatement.line = presentLine();
    s.ifStatement.thenBranch.numStatements = 0;
    s.ifStatement.elseBranch.numStatements = 0;

    consume(TOKEN_LEFT_PAREN, "Conditionals must start with an openning brace['('] after If!");
    s.ifStatement.condition = expression();
    consume(TOKEN_RIGHT_PAREN, "Conditional must end with a closing brace[')'] after If!");
    consume(TOKEN_NEWLINE, "Expected newline after If!");

    if(getNextIndent() == compiler->indentLevel){
        consumeIndent(compiler->indentLevel);
        consume(TOKEN_THEN, "Expected Then on the same indent!");
        consume(TOKEN_NEWLINE, "Expected newline after Then!");
    }

    s.ifStatement.thenBranch = blockStatement(compiler, BLOCK_IF);
    consumeIndent(compiler->indentLevel);

    if(match(TOKEN_ELSE)){
        if(match(TOKEN_IF)){
            Block elseifBlock = {0, BLOCK_ELSE, NULL};
            addToBlock(&elseifBlock, ifStatement(compiler));
            s.ifStatement.elseBranch = elseifBlock;
        }
        else{
            consume(TOKEN_NEWLINE, "Expected newline after Else!");
            s.ifStatement.elseBranch = blockStatement(compiler, BLOCK_ELSE);
            consumeIndent(compiler->indentLevel);
            consume(TOKEN_ENDIF, "Expected EndIf after If!");
            consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
        }
    }
    else{
        consume(TOKEN_ENDIF, "Expected EndIf after If!");
        consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
    }
    debug("If statement parsed");

    return s;
}